

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkDirFrame::ConstraintsBiLoad_C
          (ChLinkDirFrame *this,double factor,double recovery_clamp,bool do_clamp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  element_type *peVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_78;
  ChMatrix33<double> local_58;
  
  peVar7 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar1 = *(double *)
           ((long)(peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  dVar2 = (this->m_csys).rot.m_data[0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  dVar3 = (this->m_csys).rot.m_data[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3 * dVar1;
  auVar10 = vfmsub231sd_fma(auVar23,auVar13,auVar18);
  dVar3 = *(double *)
           ((long)(peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
           0x10);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar3;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (this->m_csys).rot.m_data[2];
  auVar10 = vfnmadd231sd_fma(auVar10,auVar24,auVar25);
  dVar4 = *(double *)
           ((long)(peVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
           0x18);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar4;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (this->m_csys).rot.m_data[3];
  auVar11 = vfnmadd231sd_fma(auVar10,auVar26,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2 * dVar1;
  auVar10 = vfmadd231sd_fma(auVar28,auVar13,auVar21);
  auVar10 = vfnmadd231sd_fma(auVar10,auVar26,auVar25);
  auVar10 = vfmadd231sd_fma(auVar10,auVar24,auVar27);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * dVar3;
  auVar9 = vfmadd231sd_fma(auVar29,auVar13,auVar25);
  auVar9 = vfmadd231sd_fma(auVar9,auVar26,auVar21);
  auVar12 = vfnmadd231sd_fma(auVar9,auVar16,auVar27);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2 * dVar4;
  auVar9 = vfmadd231sd_fma(auVar19,auVar13,auVar27);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar24,auVar21);
  auVar9 = vfmadd231sd_fma(auVar9,auVar16,auVar25);
  local_78.m_data[0] = auVar11._0_8_;
  local_78.m_data[1] = auVar10._0_8_;
  local_78.m_data[2] = auVar12._0_8_;
  local_78.m_data[3] = auVar9._0_8_;
  ChMatrix33<double>::ChMatrix33(&local_58,&local_78);
  peVar8 = (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)&(peVar8->super_ChNodeFEAxyz).field_0xf0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)&peVar8->field_0x100;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       *(double *)&peVar8->field_0xf8 *
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar10 = vfmadd231sd_fma(auVar22,auVar14,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar10 = vfmadd231sd_fma(auVar10,auVar20,auVar9);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(double *)&peVar8->field_0xf8 *
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar9 = vfmadd231sd_fma(auVar17,auVar14,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar9 = vfmadd231sd_fma(auVar9,auVar20,auVar12);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = factor;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i;
  auVar10 = vfmadd213sd_fma(auVar10,auVar15,auVar5);
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i = auVar10._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i;
  auVar10 = vfmadd213sd_fma(auVar9,auVar15,auVar6);
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i = auVar10._0_8_;
  return;
}

Assistant:

void ChLinkDirFrame::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    // if (!IsActive())
    //	return;

    ChMatrix33<> Arw = m_csys.rot >> m_body->coord.rot;
    ChVector<> res = Arw.transpose() * m_node->GetD();

    constraint1.Set_b_i(constraint1.Get_b_i() + factor * res.y());
    constraint2.Set_b_i(constraint2.Get_b_i() + factor * res.z());
}